

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigScl.c
# Opt level: O2

Vec_Ptr_t * Aig_ManReduceLachesOnce(Aig_Man_t *p)

{
  ulong *puVar1;
  ulong uVar2;
  Vec_Ptr_t *p_00;
  void *pvVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *Entry;
  ulong uVar5;
  int iVar6;
  int iVar7;
  size_t __size;
  
  p_00 = Vec_PtrAlloc(p->nObjs[2]);
  for (iVar6 = 0; iVar7 = p->nRegs, iVar6 < p->nObjs[2] - iVar7; iVar6 = iVar6 + 1) {
    pvVar3 = Vec_PtrEntry(p->vCis,iVar6);
    Vec_PtrPush(p_00,pvVar3);
  }
  __size = (long)p->vObjs->nSize << 3;
  pvVar3 = malloc(__size);
  memset(pvVar3,0xff,__size);
  iVar6 = 0;
  do {
    if (iVar7 <= iVar6) {
      free(pvVar3);
      for (iVar7 = p->nObjs[3] - iVar7; iVar7 < p->vCos->nSize; iVar7 = iVar7 + 1) {
        pvVar3 = Vec_PtrEntry(p->vCos,iVar7);
        puVar1 = (ulong *)((*(ulong *)((long)pvVar3 + 8) & 0xfffffffffffffffe) + 0x18);
        *puVar1 = *puVar1 & 0xffffffffffffffcf;
      }
      return p_00;
    }
    pAVar4 = Aig_ManLi(p,iVar6);
    Entry = Aig_ManLo(p,iVar6);
    uVar5 = (ulong)pAVar4->pFanin0 & 0xfffffffffffffffe;
    uVar2 = *(ulong *)(uVar5 + 0x18);
    if (((ulong)pAVar4->pFanin0 & 1) == 0) {
      if ((uVar2 & 0x10) == 0) {
        *(ulong *)(uVar5 + 0x18) = uVar2 | 0x10;
        *(int *)((long)pvVar3 + (long)*(int *)(uVar5 + 0x24) * 8) = iVar6;
      }
      else {
        iVar7 = *(int *)((long)pvVar3 + (long)*(int *)(uVar5 + 0x24) * 8);
LAB_0052f0c6:
        Entry = Aig_ManLo(p,iVar7);
      }
    }
    else {
      if ((uVar2 & 0x20) != 0) {
        iVar7 = *(int *)((long)pvVar3 + (long)*(int *)(uVar5 + 0x24) * 8 + 4);
        goto LAB_0052f0c6;
      }
      *(ulong *)(uVar5 + 0x18) = uVar2 | 0x20;
      *(int *)((long)pvVar3 + (long)*(int *)(uVar5 + 0x24) * 8 + 4) = iVar6;
    }
    Vec_PtrPush(p_00,Entry);
    iVar6 = iVar6 + 1;
    iVar7 = p->nRegs;
  } while( true );
}

Assistant:

Vec_Ptr_t * Aig_ManReduceLachesOnce( Aig_Man_t * p )
{
    Vec_Ptr_t * vMap;
    Aig_Obj_t * pObj, * pObjLi, * pObjLo, * pFanin;
    int * pMapping, i;
    // start mapping by adding the true PIs
    vMap = Vec_PtrAlloc( Aig_ManCiNum(p) );
    Aig_ManForEachPiSeq( p, pObj, i )
        Vec_PtrPush( vMap, pObj );
    // create mapping of fanin nodes into the corresponding latch outputs
    pMapping = ABC_FALLOC( int, 2 * Aig_ManObjNumMax(p) );
    Aig_ManForEachLiLoSeq( p, pObjLi, pObjLo, i )
    {
        pFanin = Aig_ObjFanin0(pObjLi);
        if ( Aig_ObjFaninC0(pObjLi) )
        {
            if ( pFanin->fMarkB )
            {
                Vec_PtrPush( vMap, Aig_ManLo(p, pMapping[2*pFanin->Id + 1]) );
            }
            else
            {
                pFanin->fMarkB = 1;
                pMapping[2*pFanin->Id + 1] = i;
                Vec_PtrPush( vMap, pObjLo );
            }
        }
        else
        {
            if ( pFanin->fMarkA )
            {
                Vec_PtrPush( vMap, Aig_ManLo(p, pMapping[2*pFanin->Id]) );
            }
            else
            {
                pFanin->fMarkA = 1;
                pMapping[2*pFanin->Id] = i;
                Vec_PtrPush( vMap, pObjLo );
            }
        }
    }
    ABC_FREE( pMapping );
    Aig_ManForEachLiSeq( p, pObj, i )
    {
        pFanin = Aig_ObjFanin0(pObj);
        pFanin->fMarkA = pFanin->fMarkB = 0;
    }
    return vMap;
}